

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratbuilder.cpp
# Opt level: O2

void __thiscall CaDiCaL::LratBuilder::collect_garbage_clauses(LratBuilder *this)

{
  int64_t *piVar1;
  vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_> *v;
  pointer pvVar2;
  pointer pLVar3;
  pointer ppLVar4;
  LratBuilderClause *pLVar5;
  int iVar6;
  uint uVar7;
  LratBuilderWatch *w;
  pointer pLVar8;
  iterator i;
  pointer ppLVar9;
  pointer pLVar10;
  long lVar11;
  pointer ppLVar12;
  LratBuilderClause *pLVar13;
  int iVar14;
  long lVar15;
  
  piVar1 = &(this->stats).collections;
  *piVar1 = *piVar1 + 1;
  lVar11 = this->size_vars;
  for (lVar15 = (long)(1 - (int)lVar11); lVar15 < lVar11; lVar15 = lVar15 + 1) {
    if (lVar15 != 0) {
      iVar14 = (int)lVar15;
      iVar6 = -iVar14;
      if (0 < iVar14) {
        iVar6 = iVar14;
      }
      uVar7 = ~(uint)(-1 < lVar15) + iVar6 * 2;
      pvVar2 = (this->watchers).
               super__Vector_base<std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>,_std::allocator<std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      v = pvVar2 + uVar7;
      pLVar3 = *(pointer *)
                ((long)&pvVar2[uVar7].
                        super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                        ._M_impl.super__Vector_impl_data + 8);
      pLVar8 = pvVar2[uVar7].
               super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar10 = pLVar8;
      for (; pLVar8 != pLVar3; pLVar8 = pLVar8 + 1) {
        if (pLVar8->clause->garbage == false) {
          uVar7 = pLVar8->size;
          pLVar13 = pLVar8->clause;
          pLVar10->blit = pLVar8->blit;
          pLVar10->size = uVar7;
          pLVar10->clause = pLVar13;
          pLVar10 = pLVar10 + 1;
        }
      }
      if (pLVar10 !=
          (v->
          super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>)
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar11 = (long)pLVar10 -
                 (long)(v->
                       super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                       )._M_impl.super__Vector_impl_data._M_start;
        if (lVar11 == 0) {
          erase_vector<CaDiCaL::LratBuilderWatch>(v);
        }
        else {
          std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::resize
                    (v,lVar11 >> 4);
        }
      }
    }
    lVar11 = this->size_vars;
  }
  ppLVar4 = (this->unit_clauses).
            super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar9 = (this->unit_clauses).
            super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar12 = ppLVar9;
  for (; ppLVar9 != ppLVar4; ppLVar9 = ppLVar9 + 1) {
    if ((*ppLVar9)->garbage == false) {
      *ppLVar12 = *ppLVar9;
      ppLVar12 = ppLVar12 + 1;
    }
  }
  std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::resize
            (&this->unit_clauses,
             (long)ppLVar12 -
             (long)(this->unit_clauses).
                   super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pLVar13 = this->garbage;
  while (pLVar13 != (LratBuilderClause *)0x0) {
    pLVar5 = pLVar13->next;
    delete_clause(this,pLVar13);
    pLVar13 = pLVar5;
  }
  this->garbage = (LratBuilderClause *)0x0;
  return;
}

Assistant:

void LratBuilder::collect_garbage_clauses () {

  stats.collections++;

  LOG ("LRAT BUILDER collecting %" PRIu64 " garbage clauses %.0f%%",
       num_garbage, percent (num_garbage, num_clauses));

  for (int lit = -size_vars + 1; lit < size_vars; lit++) {
    if (!lit)
      continue;
    LratBuilderWatcher &ws = watcher (lit);
    const auto end = ws.end ();
    auto j = ws.begin (), i = j;
    for (; i != end; i++) {
      LratBuilderWatch &w = *i;
      if (!w.clause->garbage)
        *j++ = w;
    }
    if (j == ws.end ())
      continue;
    if (j == ws.begin ())
      erase_vector (ws);
    else
      ws.resize (j - ws.begin ());
  }

  const auto end = unit_clauses.end ();
  auto j = unit_clauses.begin ();
  for (auto i = j; i != end; i++) {
    LratBuilderClause *c = *i;
    if (c->garbage)
      continue; // garbage clause
    *j++ = c;
  }
  unit_clauses.resize (j - unit_clauses.begin ());

  for (LratBuilderClause *c = garbage, *next; c; c = next)
    next = c->next, delete_clause (c);

  assert (!num_garbage);
  garbage = 0;
}